

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

void __thiscall
QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray>::~QStringBuilder
          (QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray> *this)

{
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->b).d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->a).b.d);
  return;
}

Assistant:

~QStringBuilder() = default;